

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolSetATimes(SUNLinearSolver S,void *ATdata,ATimesFn ATimes,int myid)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double stop_time;
  double start_time;
  int failure;
  int myid_local;
  ATimesFn ATimes_local;
  void *ATdata_local;
  SUNLinearSolver S_local;
  
  dVar2 = get_time();
  uVar1 = SUNLinSolSetATimes(S,ATdata,ATimes);
  dVar3 = get_time();
  if (uVar1 == 0) {
    if ((myid == 0) && (printf("    PASSED test -- SUNLinSolSetATimes \n"), print_time != 0)) {
      printf("    SUNLinSolSetATimes Time: %22.15e \n \n",dVar3 - dVar2);
    }
    S_local._4_4_ = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetATimes returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)(uint)myid);
    S_local._4_4_ = 1;
  }
  return S_local._4_4_;
}

Assistant:

int Test_SUNLinSolSetATimes(SUNLinearSolver S, void *ATdata,
                            ATimesFn ATimes, int myid)
{
  int     failure;
  double  start_time, stop_time;

  /* try calling SetATimes routine: should pass/fail based on expected input */
  start_time = get_time();
  failure = SUNLinSolSetATimes(S, ATdata, ATimes);
  stop_time = get_time(); 

  if (failure) {
    printf(">>> FAILED test -- SUNLinSolSetATimes returned %d on Proc %d \n", 
           failure, myid);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolSetATimes \n");
    PRINT_TIME("    SUNLinSolSetATimes Time: %22.15e \n \n", stop_time - start_time);
  }    

  return(0);
}